

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diyfp.h
# Opt level: O2

DiyFp __thiscall rapidjson::internal::DiyFp::NormalizeBoundary(DiyFp *this)

{
  ulong uVar1;
  int iVar2;
  DiyFp DVar3;
  
  iVar2 = this->e + -10;
  for (uVar1 = this->f; (uVar1 >> 0x35 & 1) == 0; uVar1 = uVar1 * 2) {
    iVar2 = iVar2 + -1;
  }
  DVar3.f = uVar1 << 10;
  DVar3.e = iVar2;
  DVar3._12_4_ = 0;
  return DVar3;
}

Assistant:

DiyFp NormalizeBoundary() const {
        DiyFp res = *this;
        while (!(res.f & (kDpHiddenBit << 1))) {
            res.f <<= 1;
            res.e--;
        }
        res.f <<= (kDiySignificandSize - kDpSignificandSize - 2);
        res.e = res.e - (kDiySignificandSize - kDpSignificandSize - 2);
        return res;
    }